

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cabal.c
# Opt level: O2

void spell_hunters_strength(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  float fVar3;
  double dVar4;
  float fVar5;
  AFFECT_DATA af;
  AFFECT_DATA AStack_88;
  
  bVar1 = is_affected(ch,sn);
  if (!bVar1) {
    bVar1 = is_npc(ch);
    if (!bVar1) {
      init_affect(&AStack_88);
      AStack_88.where = 0;
      AStack_88.aftype = 2;
      AStack_88.location = 1;
      AStack_88.modifier = (short)ch->pcdata->cabal_level + 2;
      AStack_88.level = (short)level;
      AStack_88.type = (short)sn;
      iVar2 = get_skill(ch,sn);
      AStack_88.duration = (short)iVar2 + -0x3c;
      affect_to_char(ch,&AStack_88);
      AStack_88.location = 0x13;
      dVar4 = (double)(int)ch->pcdata->bounty_credits;
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      fVar3 = (float)(dVar4 * 0.5);
      fVar5 = 31.0;
      if (fVar3 <= 31.0) {
        fVar5 = fVar3;
      }
      AStack_88.modifier =
           (short)(int)((float)(-(uint)(fVar3 < 1.0) & 0x3f800000 |
                               ~-(uint)(fVar3 < 1.0) & (uint)fVar5) + (float)(int)(ch->level / 7));
      affect_to_char(ch,&AStack_88);
      send_to_char("You feel your body surge with the newfound strength of a hunter seeking his prey!\n\r"
                   ,ch);
      act("$n seems to move with a newfound strength and agility.",ch,(void *)0x0,(void *)0x0,0);
      return;
    }
  }
  send_to_char("You already have the enhanced strength of a hunter.\n\r",ch);
  return;
}

Assistant:

void spell_hunters_strength(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;
	float bcr;

	if (is_affected(ch, sn) || is_npc(ch))
	{
		send_to_char("You already have the enhanced strength of a hunter.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_POWER;
	af.type = sn;
	af.location = APPLY_STR;
	af.modifier = ch->pcdata->cabal_level + 2;
	af.level = level;
	af.duration = (get_skill(ch, sn) - 60);
	affect_to_char(ch, &af);

	af.location = APPLY_DAMROLL;
	bcr = sqrt(ch->pcdata->bounty_credits) / 2;
	af.modifier = (int)(ch->level / 7 + URANGE(1, bcr, 31));
	affect_to_char(ch, &af);

	send_to_char("You feel your body surge with the newfound strength of a hunter seeking his prey!\n\r", ch);
	act("$n seems to move with a newfound strength and agility.", ch, 0, 0, TO_ROOM);
}